

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O1

S2CellId __thiscall S2PaddedCell::ShrinkToFit(S2PaddedCell *this,R2Rect *rect)

{
  bool bVar1;
  uint uVar2;
  S2CellId SVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  int ij_xor [2];
  int ij_min [2];
  R2Rect padded;
  uint local_80 [2];
  R2Point local_78;
  R2Rect local_68;
  S2CellId local_48;
  S2LogMessage local_40;
  
  bVar1 = R2Rect::Intersects(&this->bound_,rect);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2padded_cell.cc"
               ,0x7b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: bound().Intersects(rect) ",0x27);
    if (!bVar1) goto LAB_002082d3;
  }
  iVar7 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  if (this->level_ == 0) {
    if (((rect->bounds_[0].bounds_.c_[0] <= 0.0) && (0.0 <= rect->bounds_[0].bounds_.c_[1])) ||
       ((rect->bounds_[1].bounds_.c_[0] <= 0.0 && (0.0 <= rect->bounds_[1].bounds_.c_[1]))))
    goto LAB_00208204;
  }
  else {
    uVar6 = iVar7 + this->ij_lo_[0] * 2;
    if (0x80000000 < uVar6) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x153,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_68.bounds_[0].bounds_.c_[1],"Check failed: (si) <= (kMaxSiTi) ",
                 0x21);
LAB_002082d3:
      abort();
    }
    dVar9 = (double)uVar6 * 4.656612873077393e-10;
    if (0.5 <= dVar9) {
      dVar9 = dVar9 * 4.0 * dVar9 + -1.0;
    }
    else {
      dVar9 = (1.0 - dVar9) * -4.0 * (1.0 - dVar9) + 1.0;
    }
    if ((rect->bounds_[0].bounds_.c_[0] <= dVar9 * 0.3333333333333333) &&
       (dVar9 * 0.3333333333333333 <= rect->bounds_[0].bounds_.c_[1])) goto LAB_00208204;
    uVar6 = iVar7 + this->ij_lo_[1] * 2;
    if (0x80000000 < uVar6) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x153,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_68.bounds_[0].bounds_.c_[1],"Check failed: (si) <= (kMaxSiTi) ",
                 0x21);
      goto LAB_002082d3;
    }
    dVar9 = (double)uVar6 * 4.656612873077393e-10;
    if (0.5 <= dVar9) {
      dVar9 = dVar9 * 4.0 * dVar9 + -1.0;
    }
    else {
      dVar9 = (1.0 - dVar9) * -4.0 * (1.0 - dVar9) + 1.0;
    }
    if ((rect->bounds_[1].bounds_.c_[0] <= dVar9 * 0.3333333333333333) &&
       (dVar9 * 0.3333333333333333 <= rect->bounds_[1].bounds_.c_[1])) goto LAB_00208204;
  }
  local_78.c_[0] = this->padding_ + 3.3306690738754696e-16;
  local_78.c_[1] = local_78.c_[0];
  R2Rect::Expanded(&local_68,rect,&local_78);
  lVar5 = 0;
  do {
    dVar9 = *(double *)((long)local_68.bounds_[0].bounds_.c_ + lVar5 * 4);
    dVar8 = dVar9 * 3.0;
    if (0.0 <= dVar9) {
      dVar8 = dVar8 + 1.0;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar8 = dVar8 * 0.5;
    }
    else {
      dVar8 = 1.0 - dVar8;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar8 = dVar8 * -0.5 + 1.0;
    }
    uVar6 = (uint)ROUND(dVar8 * 1073741824.0 + -0.5);
    if (0x3ffffffe < (int)uVar6) {
      uVar6 = 0x3fffffff;
    }
    uVar4 = *(uint *)((long)this->ij_lo_ + lVar5);
    if ((int)uVar6 <= (int)uVar4) {
      uVar6 = uVar4;
    }
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    *(uint *)((long)local_78.c_ + lVar5) = uVar6;
    dVar9 = *(double *)((long)local_68.bounds_[0].bounds_.c_ + lVar5 * 4 + 8);
    dVar8 = dVar9 * 3.0;
    if (0.0 <= dVar9) {
      dVar8 = dVar8 + 1.0;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar8 = dVar8 * 0.5;
    }
    else {
      dVar8 = 1.0 - dVar8;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar8 = dVar8 * -0.5 + 1.0;
    }
    uVar4 = uVar4 + iVar7 + -1;
    uVar2 = (uint)ROUND(dVar8 * 1073741824.0 + -0.5);
    if (0x3ffffffe < (int)uVar2) {
      uVar2 = 0x3fffffff;
    }
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    if ((int)uVar4 <= (int)uVar2) {
      uVar2 = uVar4;
    }
    *(uint *)((long)local_80 + lVar5) = uVar2 ^ uVar6;
    lVar5 = lVar5 + 4;
  } while (lVar5 == 4);
  uVar6 = (local_80[1] | local_80[0]) * 2 + 1;
  uVar4 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  iVar7 = (uVar4 ^ 0x1f) - 1;
  if (this->level_ < iVar7) {
    local_48 = S2CellId::FromFaceIJ
                         ((uint)((this->id_).id_ >> 0x3d),local_78.c_[0]._0_4_,local_78.c_[0]._4_4_)
    ;
    SVar3 = S2CellId::parent(&local_48,iVar7);
    return (S2CellId)SVar3.id_;
  }
LAB_00208204:
  return (S2CellId)(this->id_).id_;
}

Assistant:

S2CellId S2PaddedCell::ShrinkToFit(const R2Rect& rect) const {
  S2_DCHECK(bound().Intersects(rect));

  // Quick rejection test: if "rect" contains the center of this cell along
  // either axis, then no further shrinking is possible.
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (level_ == 0) {
    // Fast path (most calls to this function start with a face cell).
    if (rect[0].Contains(0) || rect[1].Contains(0)) return id();
  } else {
    if (rect[0].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[0] + ij_size))) ||
        rect[1].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[1] + ij_size)))) {
      return id();
    }
  }
  // Otherwise we expand "rect" by the given padding() on all sides and find
  // the range of coordinates that it spans along the i- and j-axes.  We then
  // compute the highest bit position at which the min and max coordinates
  // differ.  This corresponds to the first cell level at which at least two
  // children intersect "rect".

  // Increase the padding to compensate for the error in S2::UVtoST().
  // (The constant below is a provable upper bound on the additional error.)
  R2Rect padded = rect.Expanded(padding() + 1.5 * DBL_EPSILON);
  int ij_min[2];  // Min i- or j- coordinate spanned by "padded"
  int ij_xor[2];  // XOR of the min and max i- or j-coordinates
  for (int d = 0; d < 2; ++d) {
    ij_min[d] = max(ij_lo_[d], S2::STtoIJ(S2::UVtoST(padded[d][0])));
    int ij_max = min(ij_lo_[d] + ij_size - 1,
                     S2::STtoIJ(S2::UVtoST(padded[d][1])));
    ij_xor[d] = ij_min[d] ^ ij_max;
  }
  // Compute the highest bit position where the two i- or j-endpoints differ,
  // and then choose the cell level that includes both of these endpoints.  So
  // if both pairs of endpoints are equal we choose kMaxLevel; if they differ
  // only at bit 0, we choose (kMaxLevel - 1), and so on.
  int level_msb = ((ij_xor[0] | ij_xor[1]) << 1) + 1;
  int level = S2CellId::kMaxLevel - Bits::FindMSBSetNonZero(level_msb);
  if (level <= level_) return id();
  return S2CellId::FromFaceIJ(id().face(), ij_min[0], ij_min[1]).parent(level);
}